

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultDistItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultDistItemSyntax,slang::syntax::DefaultDistItemSyntax_const&>
          (BumpAllocator *this,DefaultDistItemSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  DistWeightSyntax *pDVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  DefaultDistItemSyntax *pDVar10;
  
  pDVar10 = (DefaultDistItemSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_DistItemBaseSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DistItemBaseSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_DistItemBaseSyntax).super_SyntaxNode.previewNode;
  TVar6 = (args->defaultKeyword).kind;
  uVar7 = (args->defaultKeyword).field_0x2;
  NVar8.raw = (args->defaultKeyword).numFlags.raw;
  uVar9 = (args->defaultKeyword).rawLen;
  pIVar3 = (args->defaultKeyword).info;
  pDVar4 = args->weight;
  (pDVar10->super_DistItemBaseSyntax).super_SyntaxNode.kind =
       (args->super_DistItemBaseSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar10->super_DistItemBaseSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pDVar10->super_DistItemBaseSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar10->super_DistItemBaseSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar10->defaultKeyword).kind = TVar6;
  (pDVar10->defaultKeyword).field_0x2 = uVar7;
  (pDVar10->defaultKeyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pDVar10->defaultKeyword).rawLen = uVar9;
  (pDVar10->defaultKeyword).info = pIVar3;
  pDVar10->weight = pDVar4;
  return pDVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }